

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O2

string * gtest_AllBase64Test_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<Base64TestVector> *info)

{
  bool bVar1;
  tuple<testing::internal::ParamGenerator<Base64TestVector>_> t;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::ValuesIn<Base64TestVector,42ul>((testing *)&_Stack_38,&kTestVectors);
    std::
    __shared_ptr<const_testing::internal::ParamGeneratorInterface<Base64TestVector>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_28,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  testing::internal::DefaultParamName<Base64TestVector>(__return_storage_ptr__,info);
  return __return_storage_ptr__;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}